

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_range_cardinality(void **param_1)

{
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *file;
  anon_class_1_0_00000001 *unaff_retaddr;
  roaring64_bitmap_t *r_3;
  uint64_t start;
  roaring64_bitmap_t *r_2;
  roaring64_bitmap_t *r_1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000060;
  uint64_t in_stack_00000088;
  uint64_t in_stack_00000090;
  roaring64_bitmap_t *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  roaring64_bitmap_t *in_stack_ffffffffffffffd8;
  roaring64_bitmap_t *r_01;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  roaring64_bitmap_create();
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_free(in_stack_00000060);
  roaring64_bitmap_create();
  roaring64_bitmap_add_range_closed
            ((roaring64_bitmap_t *)start,(uint64_t)r_3,(uint64_t)unaff_retaddr);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffffe0,
                    (unsigned_long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_free(in_stack_00000060);
  r_00 = roaring64_bitmap_create();
  r_01 = (roaring64_bitmap_t *)0xfffffffffffffc17;
  roaring64_bitmap_add(r_00,0xfffffffffffffc17);
  roaring64_bitmap_add(r_00,(uint64_t)r_01);
  roaring64_bitmap_add(r_00,(uint64_t)r_01);
  roaring64_bitmap_add(r_00,(uint64_t)r_01);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_add(r_00,(uint64_t)r_01);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)in_stack_ffffffffffffffd0,
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_closed_cardinality(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_bitmap_free(in_stack_00000060);
  file = test_range_cardinality::anon_class_1_0_00000001::operator()(unaff_retaddr);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)file,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)file,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)file,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_cardinality
            (r_01,(uint64_t)file,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_closed_cardinality(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_closed_cardinality(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_range_closed_cardinality(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  _assert_int_equal((unsigned_long)r_00,(unsigned_long)r_01,(char *)file,in_stack_ffffffffffffffcc);
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_range_cardinality) {
    {
        roaring64_bitmap_t* r = roaring64_bitmap_create();

        roaring64_bitmap_add(r, 0);
        roaring64_bitmap_add(r, 100000);
        roaring64_bitmap_add(r, 100001);
        roaring64_bitmap_add(r, 100002);
        roaring64_bitmap_add(r, 200000);

        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 0), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 100000), 1);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 100001), 1);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 0, 200001), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range_closed(r, UINT64_MAX - 0x10000 - 10,
                                          UINT64_MAX - 0x10000 + 10);
        assert_int_equal(roaring64_bitmap_range_cardinality(
                             r, UINT64_MAX - 0x20000, UINT64_MAX),
                         21);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, UINT64_MAX - 0x10000 - 10,
                                               UINT64_MAX - 0x1000 + 11),
            21);
        roaring64_bitmap_free(r);
    }
    {
        // Range fully inside max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        uint64_t start = UINT64_MAX - 1000;

        roaring64_bitmap_add(r, start + 0);
        roaring64_bitmap_add(r, start + 100);
        roaring64_bitmap_add(r, start + 101);
        roaring64_bitmap_add(r, start + 201);

        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, start + 100), 1);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, UINT64_MAX), 4);
        roaring64_bitmap_add(r, UINT64_MAX);
        // range is exclusive, so UINT64_MAX is not included
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, start, UINT64_MAX), 4);
        // With an inclusive range, UINT64_MAX _is_ included
        assert_int_equal(
            roaring64_bitmap_range_closed_cardinality(r, start, UINT64_MAX), 5);

        roaring64_bitmap_free(r);
    }
    {
        // Empty ranges always have zero cardinality
        roaring64_bitmap_t* r =
            roaring64_bitmap_from(0, 1, 2, 3, 4, 5, UINT64_MAX);

        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 1), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, 1, 0), 0);
        assert_int_equal(roaring64_bitmap_range_cardinality(r, UINT64_MAX, 0),
                         0);
        assert_int_equal(
            roaring64_bitmap_range_cardinality(r, UINT64_MAX, UINT64_MAX), 0);
        assert_int_equal(roaring64_bitmap_range_closed_cardinality(r, 1, 0), 0);
        assert_int_equal(
            roaring64_bitmap_range_closed_cardinality(r, UINT64_MAX, 0), 0);
        assert_int_equal(roaring64_bitmap_range_closed_cardinality(
                             r, UINT64_MAX, UINT64_MAX - 1),
                         0);

        roaring64_bitmap_free(r);
    }
}